

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O1

ostream * operator<<(ostream *os,Result<unsigned_int,_double> *r)

{
  ostream *poVar1;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(r->name)._M_dataplus._M_p,(r->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," - ",3);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(r->description)._M_dataplus._M_p,(r->description)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"Absolute error: (",0x11);
  poVar1 = std::ostream::_M_insert<double>((r->absoluteErrors).minimum);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>((r->absoluteErrors).maximum);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"), mean: ",9);
  poVar1 = std::ostream::_M_insert<double>((r->absoluteErrors).mean);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", median: ",10);
  poVar1 = std::ostream::_M_insert<double>((r->absoluteErrors).median);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", variance: ",0xc);
  poVar1 = std::ostream::_M_insert<double>((r->absoluteErrors).variance);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"Relative error: (",0x11);
  poVar1 = std::ostream::_M_insert<double>((r->relativeErrors).minimum);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>((r->relativeErrors).maximum);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"), mean: ",9);
  poVar1 = std::ostream::_M_insert<double>((r->relativeErrors).mean);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", median: ",10);
  poVar1 = std::ostream::_M_insert<double>((r->relativeErrors).median);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", variance: ",0xc);
  poVar1 = std::ostream::_M_insert<double>((r->relativeErrors).variance);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"Standard deviation: ",0x14);
  poVar1 = std::ostream::_M_insert<double>(r->stddev);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"Execution time: ",0x10);
  poVar1 = std::ostream::_M_insert<double>
                     ((double)((float)(r->callNs - r->overheadNs) / (float)r->samplesInRange));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ns / call",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Result<InputT, StorageT>& r)
{
    os << r.name << " - " << r.description << std::endl;
    auto& ae = r.absoluteErrors;
    os << "Absolute error: (" << ae.minimum << ", " << ae.maximum << "), mean: " << ae.mean << ", median: " << ae.median << ", variance: " << ae.variance << std::endl;
    auto& re = r.relativeErrors;
    os << "Relative error: (" << re.minimum << ", " << re.maximum << "), mean: " << re.mean << ", median: " << re.median << ", variance: " << re.variance << std::endl;
    os << "Standard deviation: " << r.stddev << std::endl;
    os << "Execution time: " << float(r.callNs - r.overheadNs) / float(r.samplesInRange) << " ns / call" << std::endl;
    return os;
}